

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O2

void __thiscall
xLearn::CrossEntropyLoss::Evalute
          (CrossEntropyLoss *this,vector<float,_std::allocator<float>_> *pred,
          vector<float,_std::allocator<float>_> *label)

{
  index_t *piVar1;
  pointer pfVar2;
  pointer pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  ostream *poVar8;
  ulong uVar9;
  long lVar10;
  real_t rVar11;
  allocator local_96;
  allocator local_95;
  Logger local_94;
  vector<float,_std::allocator<float>_> sum;
  string local_70;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  
  pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar3 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pfVar2 == pfVar3) {
    local_94.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,&local_95);
    std::__cxx11::string::string((string *)&sum,"Evalute",&local_96);
    poVar8 = Logger::Start(ERR,&local_70,0x39,(string *)&sum);
    poVar8 = std::operator<<(poVar8,"CHECK_NE failed ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x39);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"pred.empty()");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::operator<<(poVar8,"\n");
  }
  else {
    if ((label->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start !=
        (label->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + (int)((ulong)((long)pfVar3 - (long)pfVar2) >> 2);
      local_70._M_dataplus._M_p = local_70._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<float,_std::allocator<float>_>::vector
                (&sum,(this->super_Loss).threadNumber_,(value_type *)&local_70,
                 (allocator_type *)&local_94);
      lVar10 = 0;
      uVar9 = 0;
      while (uVar4 = (this->super_Loss).threadNumber_, uVar9 < uVar4) {
        uVar5 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar6 = uVar5 / uVar4;
        sVar7 = uVar6 * (uVar9 + 1);
        local_70.field_2._M_allocated_capacity = uVar6 * uVar9;
        local_70._M_string_length = uVar5 % uVar4 + sVar7;
        if (uVar9 != uVar4 - 1) {
          local_70._M_string_length = sVar7;
        }
        local_70.field_2._8_8_ =
             (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10;
        local_70._M_dataplus._M_p = (pointer)ce_evalute_thread;
        local_50 = label;
        local_48 = pred;
        ThreadPool::
        enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
                  ((ThreadPool *)&stack0xffffffffffffffc0,
                   (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
                    *)(this->super_Loss).pool_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
        lVar10 = lVar10 + 4;
        uVar9 = uVar9 + 1;
      }
      ThreadPool::Sync((this->super_Loss).pool_,(int)uVar4);
      rVar11 = (this->super_Loss).loss_sum_;
      for (lVar10 = 0;
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != lVar10; lVar10 = lVar10 + 1) {
        rVar11 = rVar11 + sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
        (this->super_Loss).loss_sum_ = rVar11;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&sum.super__Vector_base<float,_std::allocator<float>_>);
      return;
    }
    local_94.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,&local_95);
    std::__cxx11::string::string((string *)&sum,"Evalute",&local_96);
    poVar8 = Logger::Start(ERR,&local_70,0x3a,(string *)&sum);
    poVar8 = std::operator<<(poVar8,"CHECK_NE failed ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x3a);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"label.empty()");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::operator<<(poVar8,"\n");
  }
  std::__cxx11::string::~string((string *)&sum);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_94);
  abort();
}

Assistant:

void CrossEntropyLoss::Evalute(const std::vector<real_t>& pred,
                               const std::vector<real_t>& label) {
  CHECK_NE(pred.empty(), true);
  CHECK_NE(label.empty(), true);
  total_example_ += pred.size();
  // multi-thread training
  std::vector<real_t> sum(threadNumber_, 0);
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(pred.size(), threadNumber_, i);
    size_t end_idx = getEnd(pred.size(), threadNumber_, i);
    pool_->enqueue(std::bind(ce_evalute_thread,
                             &pred,
                             &label,
                             &(sum[i]),
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
  // Accumulate loss
  for (size_t i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}